

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-customop.c
# Opt level: O1

void custom(ggml_tensor *dst,int ith,int nth,void *userdata)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  undefined1 auVar6 [16];
  char cVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  undefined8 uVar16;
  long lVar17;
  
  pgVar1 = dst->src[0];
  pgVar2 = dst->src[1];
  pgVar3 = dst->src[2];
  pgVar4 = dst->src[3];
  pgVar5 = dst->src[4];
  lVar8 = ggml_get_data();
  lVar9 = ggml_get_data_f32(pgVar1);
  lVar10 = ggml_get_data_f32(pgVar2);
  lVar11 = ggml_get_data_f32(pgVar3);
  lVar12 = ggml_get_data_f32(pgVar4);
  lVar13 = ggml_get_data_f32(pgVar5);
  if ((char *)userdata == g_userdata) {
    if (g_userdata[4] == '\0' && g_userdata._0_4_ == 0x6c6d6767) {
      cVar7 = ggml_is_contiguous(dst);
      if (cVar7 == '\0') {
        pcVar15 = "ggml_is_contiguous(dst)";
        uVar16 = 0x95;
      }
      else {
        cVar7 = ggml_is_contiguous(pgVar1);
        if (cVar7 == '\0') {
          pcVar15 = "ggml_is_contiguous(src0)";
          uVar16 = 0x96;
        }
        else {
          cVar7 = ggml_is_contiguous(pgVar2);
          if (cVar7 == '\0') {
            pcVar15 = "ggml_is_contiguous(src1)";
            uVar16 = 0x97;
          }
          else {
            cVar7 = ggml_is_contiguous(pgVar3);
            if (cVar7 == '\0') {
              pcVar15 = "ggml_is_contiguous(src2)";
              uVar16 = 0x98;
            }
            else {
              cVar7 = ggml_is_contiguous(pgVar4);
              if (cVar7 == '\0') {
                pcVar15 = "ggml_is_contiguous(src3)";
                uVar16 = 0x99;
              }
              else {
                cVar7 = ggml_is_contiguous(pgVar5);
                if (cVar7 == '\0') {
                  pcVar15 = "ggml_is_contiguous(src4)";
                  uVar16 = 0x9a;
                }
                else {
                  cVar7 = ggml_are_same_shape(dst,pgVar1);
                  if (cVar7 == '\0') {
                    pcVar15 = "ggml_are_same_shape(dst, src0)";
                    uVar16 = 0x9d;
                  }
                  else {
                    cVar7 = ggml_are_same_shape(dst,pgVar2);
                    if (cVar7 == '\0') {
                      pcVar15 = "ggml_are_same_shape(dst, src1)";
                      uVar16 = 0x9e;
                    }
                    else {
                      cVar7 = ggml_are_same_shape(dst,pgVar3);
                      if (cVar7 == '\0') {
                        pcVar15 = "ggml_are_same_shape(dst, src2)";
                        uVar16 = 0x9f;
                      }
                      else {
                        cVar7 = ggml_are_same_shape(dst,pgVar4);
                        if (cVar7 == '\0') {
                          pcVar15 = "ggml_are_same_shape(dst, src3)";
                          uVar16 = 0xa0;
                        }
                        else {
                          cVar7 = ggml_are_same_shape(dst,pgVar5);
                          if (cVar7 != '\0') {
                            lVar17 = (long)ith;
                            lVar14 = ggml_nelements(dst);
                            if (lVar17 < lVar14) {
                              do {
                                auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar11 + lVar17 * 4)),
                                                         ZEXT416(*(uint *)(lVar10 + lVar17 * 4)),
                                                         ZEXT416(*(uint *)(lVar9 + lVar17 * 4)));
                                auVar6 = vfnmadd132ss_fma(ZEXT416(*(uint *)(lVar12 + lVar17 * 4)),
                                                          auVar6,ZEXT416(*(uint *)(lVar13 + lVar17 *
                                                                                            4)));
                                *(int *)(lVar8 + lVar17 * 4) = (int)auVar6._0_4_;
                                lVar17 = lVar17 + nth;
                                lVar14 = ggml_nelements(dst);
                              } while (lVar17 < lVar14);
                            }
                            return;
                          }
                          pcVar15 = "ggml_are_same_shape(dst, src4)";
                          uVar16 = 0xa1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      pcVar15 = "strcmp(userdata, \"ggml\") == 0";
      uVar16 = 0x92;
    }
  }
  else {
    pcVar15 = "userdata == g_userdata";
    uVar16 = 0x91;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
             ,uVar16,"GGML_ASSERT(%s) failed",pcVar15);
  return;
}

Assistant:

void custom(struct ggml_tensor * dst, int ith, int nth, void * userdata) {
    struct ggml_tensor * src0 = dst->src[0];
    struct ggml_tensor * src1 = dst->src[1];
    struct ggml_tensor * src2 = dst->src[2];
    struct ggml_tensor * src3 = dst->src[3];
    struct ggml_tensor * src4 = dst->src[4];

    int32_t * dst_data = (int32_t *) ggml_get_data(dst);
    const float * src0_data = ggml_get_data_f32(src0);
    const float * src1_data = ggml_get_data_f32(src1);
    const float * src2_data = ggml_get_data_f32(src2);
    const float * src3_data = ggml_get_data_f32(src3);
    const float * src4_data = ggml_get_data_f32(src4);

    // check that the userdata is correct
    GGML_ASSERT(userdata == g_userdata);
    GGML_ASSERT(strcmp(userdata, "ggml") == 0);

    // check that the tensors are contiguous
    GGML_ASSERT(ggml_is_contiguous(dst));
    GGML_ASSERT(ggml_is_contiguous(src0));
    GGML_ASSERT(ggml_is_contiguous(src1));
    GGML_ASSERT(ggml_is_contiguous(src2));
    GGML_ASSERT(ggml_is_contiguous(src3));
    GGML_ASSERT(ggml_is_contiguous(src4));

    // check that the shapes are the same
    GGML_ASSERT(ggml_are_same_shape(dst, src0));
    GGML_ASSERT(ggml_are_same_shape(dst, src1));
    GGML_ASSERT(ggml_are_same_shape(dst, src2));
    GGML_ASSERT(ggml_are_same_shape(dst, src3));
    GGML_ASSERT(ggml_are_same_shape(dst, src4));


    for (int i = ith; i < ggml_nelements(dst); i += nth) {
        dst_data[i] = src0_data[i] + src1_data[i] * src2_data[i] - src3_data[i] * src4_data[i];
    }
}